

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Builder * __thiscall
capnp::_::PointerBuilder::initBlob<capnp::Text>
          (Builder *__return_storage_ptr__,PointerBuilder *this,ByteCount size)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  WirePointer *pWVar1;
  WirePointer *pWVar2;
  uint uVar3;
  AllocateResult AVar4;
  ThrowOverflow local_32;
  anon_class_1_0_00000001 local_31;
  
  ref = this->pointer;
  segment = this->segment;
  capTable = this->capTable;
  if (0x1ffffffe < size) {
    kj::ThrowOverflow::operator()(&local_32);
  }
  uVar3 = size + 8 >> 3;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  pWVar2 = (WirePointer *)segment->pos;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pWVar2)) >> 3 <
       (long)(ulong)uVar3) ||
     (segment->pos = (word *)(pWVar2 + uVar3), pWVar2 == (WirePointer *)0x0)) {
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    if (uVar3 == 0x1fffffff) {
      WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_31);
    }
    AVar4 = BuilderArena::allocate(this_00,uVar3 + 1);
    pWVar1 = (WirePointer *)AVar4.words;
    (ref->offsetAndKind).value =
         (int)AVar4.words - *(int *)&((AVar4.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar4.segment)->super_SegmentReader).id.value;
    (pWVar1->offsetAndKind).value = 1;
    pWVar2 = pWVar1 + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pWVar2 - (long)ref) >> 1) & 0xfffffffc) - 3;
    pWVar1 = ref;
  }
  (pWVar1->field_1).upper32Bits = size * 8 + 10;
  (__return_storage_ptr__->content).ptr = (char *)pWVar2;
  (__return_storage_ptr__->content).size_ = (ulong)size + 1;
  return __return_storage_ptr__;
}

Assistant:

Text::Builder PointerBuilder::initBlob<Text>(ByteCount size) {
  return WireHelpers::initTextPointer(pointer, segment, capTable,
      assertMax<MAX_TEXT_SIZE>(size, ThrowOverflow())).value;
}